

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

char * file_makename(lemon *lemp,char *suffix)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *pFVar8;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  char *pcVar9;
  lemon *lemp_00;
  int iVar10;
  
  pcVar6 = outputDir;
  pcVar7 = lemp->filename;
  pcVar9 = suffix;
  if (outputDir != (char *)0x0) {
    pcVar9 = (char *)0x2f;
    pcVar2 = strrchr(pcVar7,0x2f);
    if (pcVar2 != (char *)0x0) {
      pcVar7 = pcVar2 + 1;
    }
  }
  sVar3 = strlen(pcVar7);
  sVar4 = strlen(suffix);
  iVar10 = (int)sVar4 + (int)sVar3;
  if (pcVar6 != (char *)0x0) {
    sVar3 = strlen(pcVar6);
    iVar10 = iVar10 + (int)sVar3 + 1;
  }
  lemp_00 = (lemon *)(long)(iVar10 + 5);
  pcVar2 = (char *)malloc((size_t)lemp_00);
  if (pcVar2 == (char *)0x0) {
    file_makename_cold_1();
    if (lemp_00->outname != (char *)0x0) {
      free(lemp_00->outname);
    }
    pcVar7 = file_makename(lemp_00,pcVar9);
    lemp_00->outname = pcVar7;
    pFVar8 = fopen(pcVar7,(char *)CONCAT71(extraout_var,extraout_DL));
    if ((pFVar8 == (FILE *)0x0) && (*(char *)CONCAT71(extraout_var,extraout_DL) == 'w')) {
      file_open_cold_1();
    }
    return (char *)pFVar8;
  }
  *pcVar2 = '\0';
  pcVar9 = pcVar2;
  if (pcVar6 != (char *)0x0) {
    lVar5 = 0;
    do {
      cVar1 = pcVar6[lVar5];
      pcVar2[lVar5] = cVar1;
      lVar5 = lVar5 + 1;
    } while (cVar1 != '\0');
    do {
      pcVar6 = pcVar9;
      pcVar9 = pcVar6 + 1;
    } while (*pcVar6 != '\0');
    pcVar6[0] = '/';
    pcVar6[1] = '\0';
    pcVar9 = pcVar2;
  }
  do {
    pcVar6 = pcVar9;
    pcVar9 = pcVar6 + 1;
  } while (*pcVar6 != '\0');
  lVar5 = 0;
  do {
    cVar1 = pcVar7[lVar5];
    pcVar6[lVar5] = cVar1;
    lVar5 = lVar5 + 1;
  } while (cVar1 != '\0');
  pcVar6 = strrchr(pcVar2,0x2e);
  pcVar7 = pcVar2;
  if (pcVar6 != (char *)0x0) {
    *pcVar6 = '\0';
  }
  do {
    pcVar6 = pcVar7;
    pcVar7 = pcVar6 + 1;
  } while (*pcVar6 != '\0');
  lVar5 = 0;
  do {
    cVar1 = suffix[lVar5];
    pcVar6[lVar5] = cVar1;
    lVar5 = lVar5 + 1;
  } while (cVar1 != '\0');
  return pcVar2;
}

Assistant:

PRIVATE char *file_makename(struct lemon *lemp, const char *suffix)
{
  char *name;
  char *cp;
  char *filename = lemp->filename;
  int sz;

  if( outputDir ){
    cp = strrchr(filename, '/');
    if( cp ) filename = cp + 1;
  }
  sz = lemonStrlen(filename);
  sz += lemonStrlen(suffix);
  if( outputDir ) sz += lemonStrlen(outputDir) + 1;
  sz += 5;
  name = (char*)malloc( sz );
  if( name==0 ){
    fprintf(stderr,"Can't allocate space for a filename.\n");
    exit(1);
  }
  name[0] = 0;
  if( outputDir ){
    lemon_strcpy(name, outputDir);
    lemon_strcat(name, "/");
  }
  lemon_strcat(name,filename);
  cp = strrchr(name,'.');
  if( cp ) *cp = 0;
  lemon_strcat(name,suffix);
  return name;
}